

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf.cc
# Opt level: O2

int PKCS5_PBKDF2_HMAC(char *pass,int passlen,uchar *salt,int saltlen,int iter,EVP_MD *digest,
                     int keylen,uchar *out)

{
  int iVar1;
  uint uVar2;
  size_t k;
  ulong len;
  size_t sVar3;
  undefined4 in_register_0000000c;
  uint32_t j;
  uint uVar4;
  ulong uVar5;
  ulong __n;
  undefined4 in_stack_0000000c;
  uint8_t i_buf [4];
  uint8_t digest_tmp [64];
  ScopedHMAC_CTX hctx;
  undefined4 extraout_var;
  
  HMAC_CTX_init((HMAC_CTX *)&hctx);
  uVar2 = 0;
  iVar1 = HMAC_Init_ex((HMAC_CTX *)&hctx,pass,passlen,digest,(ENGINE *)0x0);
  if (iVar1 != 0) {
    uVar5 = CONCAT44(in_stack_0000000c,keylen);
    iVar1 = EVP_MD_size(digest);
    len = CONCAT44(extraout_var,iVar1);
    uVar2 = 1;
    for (; uVar5 != 0; uVar5 = uVar5 - __n) {
      __n = uVar5;
      if (len < uVar5) {
        __n = len;
      }
      i_buf = (uint8_t  [4])
              (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
      iVar1 = HMAC_Init_ex((HMAC_CTX *)&hctx,(void *)0x0,0,(EVP_MD *)0x0,(ENGINE *)0x0);
      if (iVar1 == 0) {
LAB_002091ad:
        uVar2 = 0;
        goto LAB_002091b0;
      }
      iVar1 = HMAC_Update((HMAC_CTX *)&hctx,salt,CONCAT44(in_register_0000000c,saltlen));
      if (iVar1 == 0) goto LAB_002091ad;
      iVar1 = HMAC_Update((HMAC_CTX *)&hctx,i_buf,4);
      if (iVar1 == 0) goto LAB_002091ad;
      iVar1 = HMAC_Final((HMAC_CTX *)&hctx,digest_tmp,(uint *)0x0);
      if (iVar1 == 0) goto LAB_002091ad;
      if (len != 0) {
        memcpy(out,digest_tmp,__n);
      }
      for (uVar4 = 1; uVar4 < (uint)iter; uVar4 = uVar4 + 1) {
        iVar1 = HMAC_Init_ex((HMAC_CTX *)&hctx,(void *)0x0,0,(EVP_MD *)0x0,(ENGINE *)0x0);
        if (iVar1 == 0) goto LAB_002091ad;
        iVar1 = HMAC_Update((HMAC_CTX *)&hctx,digest_tmp,len);
        if (iVar1 == 0) goto LAB_002091ad;
        iVar1 = HMAC_Final((HMAC_CTX *)&hctx,digest_tmp,(uint *)0x0);
        if (iVar1 == 0) goto LAB_002091ad;
        for (sVar3 = 0; __n != sVar3; sVar3 = sVar3 + 1) {
          out[sVar3] = out[sVar3] ^ digest_tmp[sVar3];
        }
      }
      out = out + __n;
      uVar2 = uVar2 + 1;
    }
    uVar2 = (uint)(iter != 0);
  }
LAB_002091b0:
  HMAC_CTX_cleanup((HMAC_CTX *)&hctx);
  return uVar2;
}

Assistant:

int PKCS5_PBKDF2_HMAC(const char *password, size_t password_len,
                      const uint8_t *salt, size_t salt_len, uint32_t iterations,
                      const EVP_MD *digest, size_t key_len, uint8_t *out_key) {
  // See RFC 8018, section 5.2.
  bssl::ScopedHMAC_CTX hctx;
  if (!HMAC_Init_ex(hctx.get(), password, password_len, digest, NULL)) {
    return 0;
  }

  uint32_t i = 1;
  size_t md_len = EVP_MD_size(digest);
  while (key_len > 0) {
    size_t todo = md_len;
    if (todo > key_len) {
      todo = key_len;
    }

    uint8_t i_buf[4];
    i_buf[0] = (uint8_t)((i >> 24) & 0xff);
    i_buf[1] = (uint8_t)((i >> 16) & 0xff);
    i_buf[2] = (uint8_t)((i >> 8) & 0xff);
    i_buf[3] = (uint8_t)(i & 0xff);

    // Compute U_1.
    uint8_t digest_tmp[EVP_MAX_MD_SIZE];
    if (!HMAC_Init_ex(hctx.get(), NULL, 0, NULL, NULL) ||
        !HMAC_Update(hctx.get(), salt, salt_len) ||
        !HMAC_Update(hctx.get(), i_buf, 4) ||
        !HMAC_Final(hctx.get(), digest_tmp, NULL)) {
      return 0;
    }

    OPENSSL_memcpy(out_key, digest_tmp, todo);
    for (uint32_t j = 1; j < iterations; j++) {
      // Compute the remaining U_* values and XOR.
      if (!HMAC_Init_ex(hctx.get(), NULL, 0, NULL, NULL) ||
          !HMAC_Update(hctx.get(), digest_tmp, md_len) ||
          !HMAC_Final(hctx.get(), digest_tmp, NULL)) {
        return 0;
      }
      for (size_t k = 0; k < todo; k++) {
        out_key[k] ^= digest_tmp[k];
      }
    }

    key_len -= todo;
    out_key += todo;
    i++;
  }

  // RFC 8018 describes iterations (c) as being a "positive integer", so a
  // value of 0 is an error.
  //
  // Unfortunately not all consumers of PKCS5_PBKDF2_HMAC() check their return
  // value, expecting it to succeed and unconditionally using |out_key|.  As a
  // precaution for such callsites in external code, the old behavior of
  // iterations < 1 being treated as iterations == 1 is preserved, but
  // additionally an error result is returned.
  //
  // TODO(eroman): Figure out how to remove this compatibility hack, or change
  // the default to something more sensible like 2048.
  if (iterations == 0) {
    return 0;
  }

  return 1;
}